

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O2

void __thiscall TestMeter::~TestMeter(TestMeter *this)

{
  Meter *this_00;
  TestMetrics *pTVar1;
  TestMetrics **ppTVar2;
  int i;
  ulong uVar3;
  
  this_00 = this->sourceMeter;
  if (this_00 != (Meter *)0x0) {
    fasttext::Meter::~Meter(this_00);
  }
  operator_delete(this_00,0x78);
  pTVar1 = this->metrics;
  if (pTVar1 != (TestMetrics *)0x0) {
    TestMetrics::~TestMetrics(pTVar1);
  }
  operator_delete(pTVar1,0x30);
  for (uVar3 = 0; ppTVar2 = this->labelMetrics, uVar3 < this->nlabels; uVar3 = uVar3 + 1) {
    pTVar1 = ppTVar2[uVar3];
    if (pTVar1 != (TestMetrics *)0x0) {
      TestMetrics::~TestMetrics(pTVar1);
      operator_delete(pTVar1,0x30);
    }
  }
  if (ppTVar2 != (TestMetrics **)0x0) {
    operator_delete__(ppTVar2);
    return;
  }
  return;
}

Assistant:

~TestMeter()
    {
        delete sourceMeter;
        delete metrics;

        for (int i = 0; i<nlabels; ++i)
        {
            if (labelMetrics[i] != nullptr)
            {
                delete labelMetrics[i];
            }
        }

        delete[] labelMetrics;
    }